

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

partSizeData *
initTiled(partSizeData *__return_storage_ptr__,
         vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
         *pixelData,vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *buf,
         TiledInputPart *in,Header *outHeader)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pFVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Header *h;
  undefined8 *puVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  Compression *pCVar19;
  runtime_error *this;
  long lVar20;
  uint64_t uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint64_t uVar26;
  int local_124;
  long local_120;
  Box2i dw;
  TileDescription tiling;
  uint uStack_b0;
  Slice local_68 [56];
  
  h = (Header *)Imf_3_4::TiledInputPart::header();
  iVar7 = channelCount(h);
  Imf_3_4::TiledInputPart::header();
  puVar13 = (undefined8 *)Imf_3_4::Header::tileDescription();
  _tiling = *puVar13;
  uVar6 = puVar13[1];
  Imf_3_4::TiledInputPart::header();
  piVar14 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar14;
  iVar2 = piVar14[1];
  iVar3 = piVar14[2];
  iVar4 = piVar14[3];
  uStack_b0 = (uint)uVar6;
  if (uStack_b0 < 2) {
    iVar8 = Imf_3_4::TiledInputPart::numLevels();
  }
  else {
    if (uStack_b0 != 2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"unknown tile mode");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar9 = Imf_3_4::TiledInputPart::numXLevels();
    iVar8 = Imf_3_4::TiledInputPart::numYLevels();
    iVar8 = iVar8 * iVar9;
  }
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::resize(pixelData,(long)iVar8);
  std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::resize(buf,(long)iVar8);
  iVar9 = Imf_3_4::TiledInputPart::numXLevels();
  uVar21 = 0;
  if (iVar9 < 1) {
    uVar26 = 0;
    local_120 = 0;
  }
  else {
    local_124 = 0;
    local_120 = 0;
    iVar9 = 0;
    iVar8 = 0;
    uVar26 = 0;
    do {
      iVar10 = Imf_3_4::TiledInputPart::numYLevels();
      if (0 < iVar10) {
        iVar10 = 0;
        do {
          if (iVar9 == iVar10 || uStack_b0 == 2) {
            Imf_3_4::dataWindowForLevel
                      ((TileDescription *)&dw,(int)&tiling,iVar1,iVar3,iVar2,iVar4,iVar9);
            lVar22 = (long)dw.min.x;
            lVar15 = (long)((dw.max.x - dw.min.x) + 1);
            lVar20 = (long)dw.min.y;
            lVar24 = ((dw.max.y - dw.min.y) + 1) * lVar15;
            lVar16 = (long)local_124;
            std::
            vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ::resize((pixelData->
                     super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar16,(long)iVar7);
            Imf_3_4::Header::channels();
            p_Var17 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
            Imf_3_4::Header::channels();
            p_Var18 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
            if (p_Var17 == p_Var18) {
              local_120 = 0;
            }
            else {
              lVar25 = 0;
              local_120 = 0;
              do {
                iVar11 = Imf_3_4::pixelTypeSize(p_Var17[9]._M_color);
                uVar23 = (ulong)iVar11;
                std::vector<char,_std::allocator<char>_>::resize
                          ((vector<char,_std::allocator<char>_> *)
                           (*(long *)&(pixelData->
                                      super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar16].
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + lVar25),lVar24 * uVar23);
                pFVar5 = (buf->
                         super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                Imf_3_4::Slice::Slice
                          (local_68,p_Var17[9]._M_color,
                           (char *)(*(long *)(*(long *)&(pixelData->
                                                                                                                
                                                  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar16]
                                                  .
                                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar25) -
                                   (lVar20 * lVar15 + lVar22) * uVar23),uVar23,uVar23 * lVar15,1,1,
                           0.0,false,false);
                Imf_3_4::FrameBuffer::insert((char *)(pFVar5 + lVar16),(Slice *)(p_Var17 + 1));
                local_120 = local_120 + uVar23;
                p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
                Imf_3_4::Header::channels();
                p_Var18 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
                lVar25 = lVar25 + 0x18;
              } while (p_Var17 != p_Var18);
            }
            uVar26 = uVar26 + lVar24;
            local_124 = local_124 + 1;
          }
          iVar11 = Imf_3_4::TiledInputPart::numXTiles((int)in);
          iVar12 = Imf_3_4::TiledInputPart::numYTiles((int)in);
          iVar8 = iVar8 + iVar12 * iVar11;
          iVar10 = iVar10 + 1;
          iVar11 = Imf_3_4::TiledInputPart::numYLevels();
        } while (iVar10 < iVar11);
      }
      iVar9 = iVar9 + 1;
      iVar10 = Imf_3_4::TiledInputPart::numXLevels();
    } while (iVar9 < iVar10);
    uVar21 = (uint64_t)iVar8;
  }
  __return_storage_ptr__->channelCount = 0;
  __return_storage_ptr__->tileCount = 0;
  __return_storage_ptr__->isDeep = false;
  __return_storage_ptr__->isTiled = false;
  __return_storage_ptr__->compression = NUM_COMPRESSION_METHODS;
  (__return_storage_ptr__->partType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->partType).field_2;
  (__return_storage_ptr__->partType)._M_string_length = 0;
  (__return_storage_ptr__->partType).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->rawSize = local_120 * uVar26;
  __return_storage_ptr__->pixelCount = uVar26;
  __return_storage_ptr__->tileCount = uVar21;
  __return_storage_ptr__->isTiled = true;
  Imf_3_4::TiledInputPart::header();
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->partType);
  Imf_3_4::TiledInputPart::header();
  pCVar19 = (Compression *)Imf_3_4::Header::compression();
  __return_storage_ptr__->compression = *pCVar19;
  __return_storage_ptr__->channelCount = (long)iVar7;
  return __return_storage_ptr__;
}

Assistant:

partSizeData
initTiled (
    vector<vector<vector<char>>>& pixelData,
    vector<FrameBuffer>&          buf,
    TiledInputPart&               in,
    const Header&                 outHeader)
{
    int             numChans = channelCount (in.header ());
    TileDescription tiling   = in.header ().tileDescription ();

    Box2i imageDw = in.header ().dataWindow ();
    int   totalLevels;
    switch (tiling.mode)
    {
        case ONE_LEVEL: totalLevels = 1; //break;
        case MIPMAP_LEVELS: totalLevels = in.numLevels (); break;
        case RIPMAP_LEVELS:
            totalLevels = in.numXLevels () * in.numYLevels ();
            break;
        case NUM_LEVELMODES:
        default: throw runtime_error ("unknown tile mode");
    }
    pixelData.resize (totalLevels);
    buf.resize (totalLevels);

    int     levelIndex  = 0;
    int64_t pixelSize   = 0;
    size_t  totalPixels = 0;
    int     tileCount   = 0;

    //
    // allocate memory and initialize frameBuffer for each level
    //
    for (int xLevel = 0; xLevel < in.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < in.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                Box2i dw = dataWindowForLevel (
                    tiling,
                    imageDw.min.x,
                    imageDw.max.x,
                    imageDw.min.y,
                    imageDw.max.y,
                    xLevel,
                    yLevel);
                uint64_t width     = dw.max.x + 1 - dw.min.x;
                uint64_t height    = dw.max.y + 1 - dw.min.y;
                uint64_t numPixels = width * height;
                uint64_t offsetToOrigin =
                    width * static_cast<uint64_t> (dw.min.y) +
                    static_cast<uint64_t> (dw.min.x);
                int channelNumber = 0;

                pixelData[levelIndex].resize (numChans);
                pixelSize = 0;
                for (ChannelList::ConstIterator i =
                         outHeader.channels ().begin ();
                     i != outHeader.channels ().end ();
                     ++i)
                {
                    int samplesize = pixelTypeSize (i.channel ().type);
                    pixelData[levelIndex][channelNumber].resize (
                        numPixels * samplesize);

                    buf[levelIndex].insert (
                        i.name (),
                        Slice (
                            i.channel ().type,
                            pixelData[levelIndex][channelNumber].data () -
                                offsetToOrigin * samplesize,
                            samplesize,
                            samplesize * width));
                    ++channelNumber;
                    pixelSize += samplesize;
                }
                totalPixels += numPixels;
                ++levelIndex;
            }
            tileCount += in.numXTiles (xLevel) * in.numYTiles (yLevel);
        }
    }
    partSizeData data;
    data.rawSize      = pixelSize * totalPixels;
    data.pixelCount   = totalPixels;
    data.tileCount    = tileCount;
    data.isTiled      = true;
    data.partType     = in.header ().type ();
    data.compression  = in.header ().compression ();
    data.channelCount = numChans;
    return data;
}